

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

buf_chunk * get_spare(bufq *q)

{
  CURLcode CVar1;
  bufq *local_20;
  buf_chunk *chunk;
  bufq *q_local;
  
  local_20 = (bufq *)0x0;
  chunk = (buf_chunk *)q;
  if (q->spare == (buf_chunk *)0x0) {
    if ((q->chunk_count < q->max_chunks) || ((q->opts & 1U) != 0)) {
      if (q->pool == (bufc_pool *)0x0) {
        q_local = (bufq *)(*Curl_ccalloc)(1,q->chunk_size + 0x28);
        if (q_local == (bufq *)0x0) {
          q_local = (bufq *)0x0;
        }
        else {
          q_local->tail = (buf_chunk *)chunk[1].dlen;
          (chunk->x).dummy = (void *)((long)(chunk->x).dummy + 1);
        }
      }
      else {
        CVar1 = bufcp_take(q->pool,(buf_chunk **)&local_20);
        if (CVar1 == CURLE_OK) {
          (chunk->x).dummy = (void *)((long)(chunk->x).dummy + 1);
          q_local = local_20;
        }
        else {
          q_local = (bufq *)0x0;
        }
      }
    }
    else {
      q_local = (bufq *)0x0;
    }
  }
  else {
    local_20 = (bufq *)q->spare;
    q->spare = local_20->head;
    chunk_reset((buf_chunk *)local_20);
    q_local = local_20;
  }
  return (buf_chunk *)q_local;
}

Assistant:

static struct buf_chunk *get_spare(struct bufq *q)
{
  struct buf_chunk *chunk = NULL;

  if(q->spare) {
    chunk = q->spare;
    q->spare = chunk->next;
    chunk_reset(chunk);
    return chunk;
  }

  if(q->chunk_count >= q->max_chunks && (!(q->opts & BUFQ_OPT_SOFT_LIMIT)))
    return NULL;

  if(q->pool) {
    if(bufcp_take(q->pool, &chunk))
      return NULL;
    ++q->chunk_count;
    return chunk;
  }
  else {
    chunk = calloc(1, sizeof(*chunk) + q->chunk_size);
    if(!chunk)
      return NULL;
    chunk->dlen = q->chunk_size;
    ++q->chunk_count;
    return chunk;
  }
}